

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

void __thiscall leveldb::log::LogTest::ReportCollector::~ReportCollector(ReportCollector *this)

{
  pointer pcVar1;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__ReportCollector_00117798;
  pcVar1 = (this->message_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->message_).field_2) {
    operator_delete(pcVar1);
  }
  Reader::Reporter::~Reporter(&this->super_Reporter);
  operator_delete(this);
  return;
}

Assistant:

ReportCollector() : dropped_bytes_(0) {}